

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v8::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *pcVar3;
  undefined2 *puVar4;
  char *pcVar5;
  char *end;
  unsigned_long uStack_48;
  int size_local;
  unsigned_long value_local;
  char *out_local;
  char *local_18;
  undefined2 *local_10;
  
  end._4_4_ = size;
  uStack_48 = value;
  value_local = (unsigned_long)out;
  iVar2 = count_digits(value);
  end._3_1_ = iVar2 <= size;
  ignore_unused<bool,char[20]>((bool *)((long)&end + 3),(char (*) [20])"invalid digit count");
  pcVar3 = (char *)(value_local + (long)end._4_4_);
  value_local = (unsigned_long)pcVar3;
  for (; 99 < uStack_48; uStack_48 = uStack_48 / 100) {
    puVar4 = (undefined2 *)(value_local - 2);
    value_local = (unsigned_long)puVar4;
    local_18 = digits2(uStack_48 % 100);
    *puVar4 = *(undefined2 *)local_18;
    local_10 = puVar4;
  }
  if (uStack_48 < 10) {
    out_local = (char *)(value_local - 1);
    *(char *)(value_local - 1) = (char)uStack_48 + '0';
  }
  else {
    puVar4 = (undefined2 *)(value_local - 2);
    value_local = (unsigned_long)puVar4;
    pcVar5 = digits2(uStack_48);
    *puVar4 = *(undefined2 *)pcVar5;
    out_local = (char *)value_local;
  }
  fVar1.end = pcVar3;
  fVar1.begin = out_local;
  return fVar1;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}